

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O1

void __thiscall ParallelManager::term(ParallelManager *this,function<void_()> *term_func)

{
  undefined8 uVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->m_term_done == false) {
    if ((term_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar1 = std::__throw_bad_function_call();
      pthread_mutex_unlock((pthread_mutex_t *)this);
      _Unwind_Resume(uVar1);
    }
    (*term_func->_M_invoker)((_Any_data *)term_func);
    this->m_term_done = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void term(std::function<void(void)> term_func)
	{
		std::lock_guard<std::mutex> lck(m_lock);
		if (!m_term_done)
		{
			term_func();
			m_term_done = true;
		}
	}